

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O2

void es::init::static_obj_stack<es::init::singletons_meta_data>::push(singletons_meta_data *p)

{
  sequenced_ptr<es::init::singletons_meta_data> expected_value;
  sequenced_ptr<es::init::singletons_meta_data> new_value;
  bool bVar1;
  singletons_meta_data *psVar2;
  undefined8 unaff_RBX;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  undefined8 unaff_retaddr;
  
  do {
    psVar2 = (singletons_meta_data *)0x0;
    LOCK();
    if ((anon_union_16_2_61a8b2f2_for__u)ZEXT816(0) == top._u) {
      top._u = (anon_union_16_2_61a8b2f2_for__u)ZEXT816(0);
    }
    else {
      psVar2 = top._u._0_8_;
    }
    UNLOCK();
    p->_next = psVar2;
    expected_value._u._s._seq = unaff_R14;
    expected_value._u._s._p = (singletons_meta_data *)unaff_RBX;
    new_value._u._s._seq = unaff_retaddr;
    new_value._u._s._p = (singletons_meta_data *)unaff_R15;
    bVar1 = sequenced_ptr<es::init::singletons_meta_data>::cas(&top,expected_value,new_value);
  } while (!bVar1);
  return;
}

Assistant:

static void push(T* p)
    {
        sequenced_ptr<T> stack_top;
        sequenced_ptr<T> new_top;
        do
        {
            stack_top = top.load();
            new_top   = stack_top;

            p->_next         = stack_top._u._s._p;
            new_top._u._s._p = p;
            ++new_top._u._s._seq;
        } while (!top.cas(stack_top, new_top));
    }